

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O2

void __thiscall CFGGrindReader::loadCFGs(CFGGrindReader *this)

{
  string *psVar1;
  int iVar2;
  Type TVar3;
  uint __line;
  bool bVar4;
  CfgNode *this_00;
  BlockData *this_01;
  CFG *pCVar5;
  CfgNode *pCVar6;
  Instruction *instr;
  CFG *pCVar7;
  undefined8 uVar8;
  char *__assertion;
  int size;
  Addr AVar9;
  unsigned_long_long uVar10;
  Addr AVar11;
  string keyword;
  string fname;
  
  psVar1 = &(this->m_current).token;
LAB_0010b6bb:
  if ((this->m_current).type != TKN_BRACKET_OPEN) {
    matchToken(this,TKN_EOF);
    CFGReader::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&keyword,
                    &this->super_CFGReader);
    for (uVar8 = keyword.field_2._8_8_; (size_type *)uVar8 != &keyword._M_string_length;
        uVar8 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar8)) {
      CFG::check(*(CFG **)(uVar8 + 0x20));
    }
    std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
    ~_Rb_tree((_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>
               *)&keyword);
    return;
  }
  matchToken(this,TKN_BRACKET_OPEN);
  std::__cxx11::string::string((string *)&keyword,(string *)psVar1);
  matchToken(this,TKN_KEYWORD);
  bVar4 = std::operator==(&keyword,"cfg");
  if (!bVar4) {
    bVar4 = std::operator==(&keyword,"node");
    if (!bVar4) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                    ,0xc3,"virtual void CFGGrindReader::loadCFGs()");
    }
    AVar9 = (this->m_current).data.addr;
    matchToken(this,TKN_ADDR);
    pCVar5 = CFGReader::instance(&this->super_CFGReader,AVar9);
    AVar9 = (this->m_current).data.addr;
    matchToken(this,TKN_ADDR);
    this_00 = CFG::nodeByAddr(pCVar5,AVar9);
    this_01 = (BlockData *)operator_new(0x90);
    CfgNode::BlockData::BlockData(this_01,AVar9,0,false);
    if (this_00 == (CfgNode *)0x0) {
      this_00 = (CfgNode *)operator_new(0x18);
      CfgNode::CfgNode(this_00,CFG_BLOCK);
      CfgNode::setData(this_00,(Data *)this_01);
      CFG::addNode(pCVar5,this_00);
    }
    else {
      if (this_00->m_type != CFG_PHANTOM) {
        __assertion = "node->type() == CfgNode::CFG_PHANTOM";
        __line = 0x4e;
        goto LAB_0010bc2a;
      }
      CfgNode::setData(this_00,(Data *)this_01);
    }
    if (AVar9 == pCVar5->m_addr) {
      if (pCVar5->m_entryNode != (CfgNode *)0x0) {
        __assertion = "cfg->entryNode() == 0";
        __line = 0x53;
        goto LAB_0010bc2a;
      }
      pCVar6 = CFGReader::entryNode(pCVar5);
      CFG::addEdge(pCVar5,pCVar6,this_00,pCVar5->m_execs);
    }
    iVar2 = *(int *)&(this->m_current).data;
    matchToken(this,TKN_NUMBER);
    matchToken(this,TKN_BRACKET_OPEN);
    while ((this->m_current).type != TKN_BRACKET_CLOSE) {
      AVar11 = (this->m_current).data.addr;
      matchToken(this,TKN_NUMBER);
      size = (int)AVar11;
      instr = Instruction::get(AVar9,size);
      CfgNode::BlockData::addInstruction(this_01,instr);
      AVar9 = AVar9 + (long)size;
    }
    matchToken(this,TKN_BRACKET_CLOSE);
    if (this_01->m_size == iVar2) {
      matchToken(this,TKN_BRACKET_OPEN);
      while ((this->m_current).type != TKN_BRACKET_CLOSE) {
        AVar9 = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        if ((this->m_current).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          uVar10 = (this->m_current).data.number;
          matchToken(this,TKN_NUMBER);
        }
        else {
          uVar10 = 0;
        }
        pCVar7 = CFGReader::instance(&this->super_CFGReader,AVar9);
        CfgNode::BlockData::addCall(this_01,pCVar7,uVar10);
      }
      matchToken(this,TKN_BRACKET_CLOSE);
      matchToken(this,TKN_BRACKET_OPEN);
      while ((this->m_current).type != TKN_BRACKET_CLOSE) {
        iVar2 = *(int *)&(this->m_current).data;
        matchToken(this,TKN_NUMBER);
        matchToken(this,TKN_ARROW);
        AVar9 = (this->m_current).data.addr;
        matchToken(this,TKN_ADDR);
        if ((this->m_current).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          uVar10 = (this->m_current).data.number;
          matchToken(this,TKN_NUMBER);
        }
        else {
          uVar10 = 0;
        }
        pCVar7 = CFGReader::instance(&this->super_CFGReader,AVar9);
        CfgNode::BlockData::addSignalHandler(this_01,iVar2,pCVar7,uVar10);
      }
      matchToken(this,TKN_BRACKET_CLOSE);
      bVar4 = (this->m_current).data.boolean;
      matchToken(this,TKN_BOOL);
      CfgNode::BlockData::setIndirect(this_01,bVar4);
      matchToken(this,TKN_BRACKET_OPEN);
      do {
        TVar3 = (this->m_current).type;
        if (TVar3 == TKN_ADDR) {
          AVar9 = (this->m_current).data.addr;
          matchToken(this,TKN_ADDR);
          pCVar6 = CFGReader::nodeWithAddr(pCVar5,AVar9);
        }
        else {
          if (TVar3 != TKN_KEYWORD) goto LAB_0010bb03;
          std::__cxx11::string::_M_assign((string *)&keyword);
          matchToken(this,TKN_KEYWORD);
          bVar4 = std::operator==(&keyword,"exit");
          if (bVar4) {
            pCVar6 = CFGReader::exitNode(pCVar5);
          }
          else {
            bVar4 = std::operator==(&keyword,"halt");
            if (!bVar4) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                            ,0xaf,"virtual void CFGGrindReader::loadCFGs()");
            }
            pCVar6 = CFGReader::haltNode(pCVar5);
          }
        }
        if ((this->m_current).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          uVar10 = (this->m_current).data.number;
          matchToken(this,TKN_NUMBER);
        }
        else {
          uVar10 = 0;
        }
        CFG::addEdge(pCVar5,this_00,pCVar6,uVar10);
      } while( true );
    }
    __assertion = "bsize == data->size()";
    __line = 0x68;
LAB_0010bc2a:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                  ,__line,"virtual void CFGGrindReader::loadCFGs()");
  }
  AVar9 = (this->m_current).data.addr;
  matchToken(this,TKN_ADDR);
  if ((this->m_current).type == TKN_COLON) {
    matchToken(this,TKN_COLON);
    AVar11 = (this->m_current).data.addr;
    matchToken(this,TKN_NUMBER);
  }
  else {
    AVar11 = 0;
  }
  std::__cxx11::string::string((string *)&fname,(string *)psVar1);
  matchToken(this,TKN_STRING);
  matchToken(this,TKN_BOOL);
  pCVar5 = CFGReader::instance(&this->super_CFGReader,AVar9);
  CFG::setFunctionName(pCVar5,&fname);
  pCVar5->m_execs = pCVar5->m_execs + AVar11;
  std::__cxx11::string::~string((string *)&fname);
  goto LAB_0010bb13;
LAB_0010bb03:
  if (TVar3 != TKN_BRACKET_CLOSE) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                  ,0xb4,"virtual void CFGGrindReader::loadCFGs()");
  }
  matchToken(this,TKN_BRACKET_CLOSE);
LAB_0010bb13:
  matchToken(this,TKN_BRACKET_CLOSE);
  std::__cxx11::string::~string((string *)&keyword);
  goto LAB_0010b6bb;
}

Assistant:

void CFGGrindReader::loadCFGs() {
	while (m_current.type == InputTokenizer::Lexeme::TKN_BRACKET_OPEN) {
		matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);

		std::string keyword = m_current.token;
		matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

		if (keyword == "cfg") {
			Addr addr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			unsigned long long execs = 0;
			if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
				matchToken(InputTokenizer::Lexeme::TKN_COLON);

				execs = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
			}

			std::string fname = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			matchToken(InputTokenizer::Lexeme::TKN_BOOL);

			CFG* cfg = this->instance(addr);
			cfg->setFunctionName(fname);
			cfg->updateExecs(execs);
		} else if (keyword == "node") {
			Addr faddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			CFG* cfg = this->instance(faddr);

			Addr baddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			CfgNode* node = cfg->nodeByAddr(baddr);
			CfgNode::BlockData* data = new CfgNode::BlockData(baddr);
			if (node == 0) {
				node = new CfgNode(CfgNode::CFG_BLOCK);
				node->setData(data);
				cfg->addNode(node);
			} else {
				assert(node->type() == CfgNode::CFG_PHANTOM);
				node->setData(data);
			}

			if (baddr == cfg->addr()) {
				assert(cfg->entryNode() == 0);
				CfgNode* entry = CFGReader::entryNode(cfg);
				cfg->addEdge(entry, node, cfg->execs());
			}

			int bsize = m_current.data.number;
			matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			Addr iaddr = baddr;
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				int size = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

				Instruction* instr = Instruction::get(iaddr, size);
				data->addInstruction(instr);

				iaddr += size;
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			assert(bsize == data->size());

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				Addr caddr = m_current.data.addr;
				matchToken(InputTokenizer::Lexeme::TKN_ADDR);

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				CFG* call = this->instance(caddr);
				data->addCall(call, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				int sigid = m_current.data.number;
				matchToken(InputTokenizer::Lexeme::TKN_NUMBER);

				matchToken(InputTokenizer::Lexeme::TKN_ARROW);

				Addr saddr = m_current.data.addr;
				matchToken(InputTokenizer::Lexeme::TKN_ADDR);

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				CFG* handler = this->instance(saddr);
				data->addSignalHandler(sigid, handler, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);

			bool indirect = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			data->setIndirect(indirect);

			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_OPEN);
			while (m_current.type != InputTokenizer::Lexeme::TKN_BRACKET_CLOSE) {
				CfgNode* dst = 0;

				switch (m_current.type) {
					case InputTokenizer::Lexeme::TKN_ADDR:
						{
							Addr saddr = m_current.data.addr;
							matchToken(InputTokenizer::Lexeme::TKN_ADDR);

							dst = this->nodeWithAddr(cfg, saddr);
						}

						break;
					case InputTokenizer::Lexeme::TKN_KEYWORD:
						keyword = m_current.token;
						matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

						if (keyword == "exit")
							dst = CFGReader::exitNode(cfg);
						else if (keyword == "halt")
							dst = CFGReader::haltNode(cfg);
						else {
							// std::cout << keyword << std::endl;
							assert(false);
						}

						break;
					default:
						assert(false);
				}

				unsigned long long count = 0;
				if (m_current.type == InputTokenizer::Lexeme::TKN_COLON) {
					matchToken(InputTokenizer::Lexeme::TKN_COLON);

					count = m_current.data.number;
					matchToken(InputTokenizer::Lexeme::TKN_NUMBER);
				}

				cfg->addEdge(node, dst, count);
			}
			matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);
		} else {
			assert(false);
		}

		matchToken(InputTokenizer::Lexeme::TKN_BRACKET_CLOSE);
	}

	matchToken(InputTokenizer::Lexeme::TKN_EOF);

	for (CFG* cfg : this->cfgs())
		cfg->check();
}